

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

tuple<unsigned_long,_unsigned_long,_int> * __thiscall
greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_computer::directed_flag_complex_computer_t_&>
::get_coboundary_size_and_gap_and_pivot
          (greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_computer::directed_flag_complex_computer_t_&>
           *this,filtration_entry_t a)

{
  entry_t e;
  bool bVar1;
  index_t iVar2;
  undefined2 in_CX;
  undefined8 in_RDX;
  coboundary_iterator_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *in_RSI;
  tuple<unsigned_long,_unsigned_long,_int> *in_RDI;
  filtration_entry_t fVar3;
  index_t next_index;
  size_t coboundary_size;
  coboundary_iterator_t<directed_flag_complex_computer::directed_flag_complex_computer_t> iterator;
  size_t gap_after_pivot;
  index_t pivot;
  tuple<unsigned_long,_unsigned_long,_int> *__args_1;
  unsigned_long *in_stack_ffffffffffffff48;
  undefined4 local_b0;
  index_t iStack_a4;
  float in_stack_ffffffffffffff9c;
  entry_t in_stack_ffffffffffffffa0;
  int local_34;
  undefined4 local_1c;
  
  local_1c = CONCAT22(local_1c._2_2_,in_CX);
  local_34 = 0;
  fVar3.super_pair<float,_entry_t>.second = in_stack_ffffffffffffffa0;
  fVar3.super_pair<float,_entry_t>.first = in_stack_ffffffffffffff9c;
  __args_1 = in_RDI;
  directed_flag_complex_computer::directed_flag_complex_computer_t::coboundary
            ((directed_flag_complex_computer_t *)CONCAT44(local_1c,(int)((ulong)in_RDX >> 0x20)),
             fVar3);
  while (bVar1 = directed_flag_complex_computer::
                 coboundary_iterator_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
                 ::has_next((coboundary_iterator_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
                             *)in_stack_ffffffffffffffa0), bVar1) {
    fVar3 = directed_flag_complex_computer::
            coboundary_iterator_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
            ::next(in_RSI);
    in_stack_ffffffffffffff48 = fVar3.super_pair<float,_entry_t>._0_8_;
    local_b0 = CONCAT22(local_b0._2_2_,fVar3.super_pair<float,_entry_t>.second.coefficient);
    iStack_a4 = fVar3.super_pair<float,_entry_t>.second.index;
    e._4_4_ = local_b0;
    e.index = iStack_a4;
    iVar2 = get_index(e);
    if (local_34 < iVar2) {
      local_34 = iVar2;
    }
  }
  std::make_tuple<unsigned_long&,unsigned_long&,int&>
            (in_stack_ffffffffffffff48,(unsigned_long *)__args_1,(int *)in_RDI);
  return __args_1;
}

Assistant:

std::tuple<size_t, size_t, index_t> get_coboundary_size_and_gap_and_pivot(filtration_entry_t a) const {
		// Look at the first two gaps of the pivot and the next element
		index_t pivot = 0;
		size_t gap_after_pivot = 0;
		auto iterator = complex.coboundary(a);
		size_t coboundary_size = 0;
		while (iterator.has_next()) {
			coboundary_size++;
			index_t next_index = get_index(iterator.next().second);
			if (next_index > pivot) {
				gap_after_pivot = next_index - pivot;
				pivot = next_index;
			}
		}

		return std::make_tuple(coboundary_size, gap_after_pivot, pivot);
	}